

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

size_t dictionary_text_get_lexicon(dictionary_t t_dictionary,entry *lexicon)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  
  sVar6 = *t_dictionary;
  sVar4 = sVar6;
  lVar5 = 0;
  while (bVar7 = sVar6 != 0, sVar6 = sVar6 - 1, bVar7) {
    puVar1 = (undefined8 *)(*(long *)((long)t_dictionary + 0x10) + lVar5);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&lexicon->key + lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    lVar5 = lVar5 + 0x10;
  }
  return sVar4;
}

Assistant:

size_t dictionary_text_get_lexicon(dictionary_t t_dictionary, entry * lexicon)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t i;
	for (i = 0; i < text_dictionary->entry_count; i ++)
	{
		lexicon[i].key = text_dictionary->lexicon[i].key;
		lexicon[i].value = text_dictionary->lexicon[i].value;
	}

	return text_dictionary->entry_count;
}